

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O3

error_code
anon_unknown.dwarf_14745b::validate_section_ifixups<pstore::repo::generic_section>
          (fragment *f,generic_section *s)

{
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  error e;
  ulong uVar5;
  long lVar6;
  long lVar7;
  container<unsigned_char> cVar8;
  error_code eVar9;
  
  cVar8 = pstore::repo::generic_section::payload(s);
  pbVar3 = (byte *)((ulong)(cVar8.end_ + 7) & 0xfffffffffffffff8);
  uVar5 = (ulong)((s->field_0).field32_ >> 5 & 0xfffffff8) * 3;
  pbVar1 = pbVar3 + uVar5;
  uVar2 = (f->arr_).sa_.bitmap_;
  lVar6 = (long)((uVar5 >> 3) * -0x5555555555555555) >> 2;
  pbVar4 = pbVar3;
  if (0 < lVar6) {
    pbVar4 = pbVar3 + lVar6 * 0x60;
    lVar7 = lVar6 + 1;
    pbVar3 = pbVar3 + 0x30;
    do {
      if ((0x1f < pbVar3[-0x30]) || ((1 << (pbVar3[-0x30] & 0x1f) & uVar2) == 0)) {
        pbVar3 = pbVar3 + -0x30;
        goto LAB_0011fc97;
      }
      if ((0x1f < pbVar3[-0x18]) || ((1 << (pbVar3[-0x18] & 0x1f) & uVar2) == 0)) {
        pbVar3 = pbVar3 + -0x18;
        goto LAB_0011fc97;
      }
      if ((0x1f < *pbVar3) || ((1 << (*pbVar3 & 0x1f) & uVar2) == 0)) goto LAB_0011fc97;
      if ((0x1f < pbVar3[0x18]) || ((1 << (pbVar3[0x18] & 0x1f) & uVar2) == 0)) {
        pbVar3 = pbVar3 + 0x18;
        goto LAB_0011fc97;
      }
      lVar7 = lVar7 + -1;
      pbVar3 = pbVar3 + 0x60;
    } while (1 < lVar7);
    uVar5 = uVar5 + lVar6 * -0x60;
  }
  lVar6 = ((long)uVar5 >> 3) * -0x5555555555555555;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pbVar3 = pbVar1;
      if (((lVar6 != 3) || (pbVar3 = pbVar4, 0x1f < *pbVar4)) ||
         ((1 << (*pbVar4 & 0x1f) & uVar2) == 0)) goto LAB_0011fc97;
      pbVar4 = pbVar4 + 0x18;
    }
    pbVar3 = pbVar4;
    if ((0x1f < *pbVar4) || ((1 << (*pbVar4 & 0x1f) & uVar2) == 0)) goto LAB_0011fc97;
    pbVar4 = pbVar4 + 0x18;
  }
  pbVar3 = pbVar4;
  if ((*pbVar4 < 0x20) && ((1 << (*pbVar4 & 0x1f) & uVar2) != 0)) {
    pbVar3 = pbVar1;
  }
LAB_0011fc97:
  e = internal_fixup_target_not_found;
  if (pbVar3 == pbVar1) {
    e = none;
  }
  eVar9 = pstore::exchange::import_ns::make_error_code(e);
  return eVar9;
}

Assistant:

std::error_code validate_section_ifixups (pstore::repo::fragment const & f, Section const & s) {
        using pstore::exchange::import_ns::error;

        auto const container = s.ifixups ();
        return std::any_of (std::begin (container), std::end (container),
                            [&] (pstore::repo::internal_fixup const & ifx) {
                                return !f.has_section (ifx.section);
                            })
                   ? error::internal_fixup_target_not_found
                   : error::none;
    }